

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

void __thiscall Bracket::~Bracket(Bracket *this)

{
  bool bVar1;
  reference ppAVar2;
  _Self local_20;
  _Self local_18;
  iterator cursor;
  Bracket *this_local;
  
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00112c00;
  cursor._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::end(&this->para);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppAVar2 = std::_List_iterator<Atom_*>::operator*(&local_18);
    if (*ppAVar2 != (Atom *)0x0) {
      ppAVar2 = std::_List_iterator<Atom_*>::operator*(&local_18);
      if (*ppAVar2 != (Atom *)0x0) {
        (*(*ppAVar2)->_vptr_Atom[1])();
      }
      ppAVar2 = std::_List_iterator<Atom_*>::operator*(&local_18);
      *ppAVar2 = (Atom *)0x0;
    }
    std::_List_iterator<Atom_*>::operator++(&local_18,0);
  }
  std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::~list(&this->para);
  std::__cxx11::string::~string((string *)&this->func);
  Atom::~Atom(&this->super_Atom);
  return;
}

Assistant:

Bracket::~Bracket() {
    auto cursor = para.begin();
    while (cursor != para.end()) {
        if (*cursor != NULL) {
            delete *cursor;
            *cursor = NULL;
        }
        cursor++;
    }
}